

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memops.c
# Opt level: O1

void dmrC_simplify_memops(dmr_C *C,entrypoint *ep)

{
  undefined8 C_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  instruction *piVar6;
  instruction *piVar7;
  pseudo_t ppVar8;
  unsigned_long generation;
  undefined1 local_90 [8];
  ptr_list_iter bbiter__;
  undefined1 auStack_68 [8];
  pseudo_list *dominators;
  ptr_list *local_58;
  undefined1 auStack_50 [8];
  ptr_list_iter insniter__;
  
  insniter__._16_8_ = C;
  ptrlist_reverse_iterator((ptr_list_iter *)local_90,(ptr_list *)ep->bbs);
  pvVar5 = ptrlist_iter_prev((ptr_list_iter *)local_90);
  if (pvVar5 != (void *)0x0) {
    do {
      bbiter__._16_8_ = pvVar5;
      ptrlist_reverse_iterator((ptr_list_iter *)auStack_50,*(ptr_list **)((long)pvVar5 + 0x30));
      piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_50);
      while (piVar6 != (instruction *)0x0) {
        if ((piVar6->bb != (basic_block *)0x0) && (*(char *)piVar6 == ')')) {
          ppVar8 = (piVar6->field_6).field_4.phi_src;
          iVar2 = local_pseudo(ppVar8);
          dmrC_check_access((dmr_C *)insniter__._16_8_,piVar6);
          if ((*(byte *)((long)&piVar6->type->field_14 + 0x18) & 0x20) == 0) {
            local_58 = insniter__.__list;
            auStack_68 = auStack_50;
            dominators = (pseudo_list *)insniter__.__head;
            piVar7 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_68);
            if (piVar7 != (instruction *)0x0) {
              do {
                if (piVar7->bb == (basic_block *)0x0) {
                  cVar1 = '\a';
                }
                else {
                  iVar3 = dmrC_dominates((dmr_C *)insniter__._16_8_,ppVar8,piVar6,piVar7,iVar2);
                  if (iVar3 == 0) {
                    cVar1 = '\0';
                  }
                  else if (iVar3 < 0) {
                    cVar1 = (*(char *)piVar7 != ')') + '\a';
                  }
                  else {
                    dmrC_convert_load_instruction
                              ((dmr_C *)insniter__._16_8_,piVar6,(piVar7->field_5).target);
                    cVar1 = '\b';
                  }
                }
                if ((cVar1 != '\a') && (cVar1 != '\0')) goto LAB_001345e2;
                piVar7 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_68);
              } while (piVar7 != (instruction *)0x0);
              cVar1 = '\0';
LAB_001345e2:
              if (cVar1 != '\0') goto LAB_0013467e;
            }
            generation = *(long *)(*(long *)(insniter__._16_8_ + 0x20) + 0x248) + 1;
            *(unsigned_long *)(*(long *)(insniter__._16_8_ + 0x20) + 0x248) = generation;
            *(unsigned_long *)(bbiter__._16_8_ + 8) = generation;
            auStack_68 = (undefined1  [8])0x0;
            iVar3 = find_dominating_parents
                              ((dmr_C *)insniter__._16_8_,ppVar8,piVar6,
                               (basic_block *)bbiter__._16_8_,generation,(pseudo_list **)auStack_68,
                               iVar2);
            C_00 = insniter__._16_8_;
            if (iVar3 != 0) {
              if (auStack_68 == (undefined1  [8])0x0) {
                if (iVar2 != 0) {
                  if (ppVar8->type == PSEUDO_ARG) {
                    __assert_fail("pseudo->type != PSEUDO_ARG",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/memops.c"
                                  ,0x80,"void simplify_loads(struct dmr_C *, struct basic_block *)")
                    ;
                  }
                  ppVar8 = dmrC_value_pseudo((dmr_C *)insniter__._16_8_,piVar6->type,0);
                  dmrC_convert_load_instruction((dmr_C *)C_00,piVar6,ppVar8);
                }
              }
              else {
                dmrC_rewrite_load_instruction
                          ((dmr_C *)insniter__._16_8_,piVar6,(pseudo_list *)auStack_68);
              }
            }
          }
        }
LAB_0013467e:
        piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_50);
      }
      pvVar5 = ptrlist_iter_prev((ptr_list_iter *)local_90);
    } while (pvVar5 != (void *)0x0);
  }
  ptrlist_reverse_iterator((ptr_list_iter *)local_90,(ptr_list *)ep->bbs);
  pvVar5 = ptrlist_iter_prev((ptr_list_iter *)local_90);
  if (pvVar5 != (void *)0x0) {
    do {
      ptrlist_reverse_iterator((ptr_list_iter *)auStack_50,*(ptr_list **)((long)pvVar5 + 0x30));
      piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_50);
      while (piVar6 != (instruction *)0x0) {
        if ((piVar6->bb != (basic_block *)0x0) && (*(char *)piVar6 == '*')) {
          ppVar8 = (piVar6->field_6).field_4.phi_src;
          iVar2 = local_pseudo(ppVar8);
          local_58 = insniter__.__list;
          auStack_68 = auStack_50;
          dominators = (pseudo_list *)insniter__.__head;
          piVar7 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_68);
          while (piVar7 != (instruction *)0x0) {
            if (piVar7->bb == (basic_block *)0x0) {
              iVar3 = 7;
            }
            else {
              iVar4 = dmrC_dominates((dmr_C *)insniter__._16_8_,ppVar8,piVar6,piVar7,iVar2);
              iVar3 = 0;
              if (((iVar4 != 0) && (iVar3 = 8, -1 < iVar4)) && ((char)*(uint *)piVar7 != ')')) {
                piVar7->bb = (basic_block *)0x0;
                *(uint *)piVar7 = *(uint *)piVar7 & 0xffffff00 | 0x39;
                dmrC_kill_use((dmr_C *)insniter__._16_8_,&(piVar7->field_5).target);
                iVar3 = 0;
              }
            }
            if ((iVar3 != 7) && (iVar3 != 0)) break;
            piVar7 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_68);
          }
        }
        piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_50);
      }
      pvVar5 = ptrlist_iter_prev((ptr_list_iter *)local_90);
    } while (pvVar5 != (void *)0x0);
  }
  return;
}

Assistant:

void dmrC_simplify_memops(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		simplify_loads(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		kill_dominated_stores(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);
}